

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.cpp
# Opt level: O0

double * numerary::Numerary::integrate_simpson
                   (_func_double_double *f,double *a,double *b,double *eps)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double fx_3;
  double fx_2;
  double fx_1;
  double ans;
  double error;
  double h_new;
  double h;
  double chi;
  double dt;
  double I_2;
  double I_1;
  double x;
  double *return_value;
  double *eps_local;
  double *b_local;
  double *a_local;
  _func_double_double *f_local;
  
  pdVar1 = (double *)operator_new__(0x10);
  I_1 = *a;
  ans = 0.0;
  fx_1 = 0.0;
  h_new = *b - *a;
  while (I_1 < *b - *eps) {
    dVar2 = (*f)(I_1);
    dVar3 = (*f)(I_1 + h_new / 2.0);
    dVar4 = (*f)(I_1 + h_new);
    dVar5 = (*f)(I_1 + h_new / 4.0);
    dVar6 = (*f)(I_1 + (h_new * 3.0) / 4.0);
    dVar5 = (h_new / 12.0) * (dVar6 * 4.0 + dVar3 + dVar3 + dVar5 * 4.0 + dVar2 + dVar4);
    dVar2 = (dVar5 - (h_new / 6.0) * (dVar3 * 4.0 + dVar2 + dVar4)) / 15.0;
    h = pow(ABS(dVar2) / *eps,0.2);
    if (10000.0 < h) {
      h = 10000.0;
    }
    if (h < 0.0001) {
      h = 0.0001;
    }
    dVar3 = (h_new * 0.95) / h;
    if (ABS(dVar2) < *eps) {
      I_1 = h_new + I_1;
      fx_1 = dVar5 + fx_1;
      ans = ABS(dVar2) + ans;
    }
    dVar2 = I_1 + dVar3;
    h_new = dVar3;
    if (*b <= dVar2 && dVar2 != *b) {
      h_new = *b - I_1;
    }
  }
  *pdVar1 = fx_1;
  pdVar1[1] = ans;
  return pdVar1;
}

Assistant:

double* Numerary::integrate_simpson(double (*f)(double), const double& a, const double& b, const double& eps)
    {
        double *return_value = new double[2], x = a, I_1, I_2, dt, chi, h = b - a, h_new, error = 0, ans = 0, fx_1, fx_2, fx_3;
        
        while (x < b - eps) {
            // Simpson's rule formulas
            fx_1 = f(x), fx_2 = f(x + h/2), fx_3 = f(x + h);
            I_1 = (h/6) * (fx_1 + 4*fx_2 + fx_3);
            I_2 = (h/12) * (fx_1 + 4*f(x + h/4) + 2*fx_2 + 4*f(x + (3*h)/4) + fx_3);

            dt = (I_2 - I_1) / 15;
            chi = pow(fabs(dt)/eps, 0.2);

            if(chi > 1e4) chi = 1e4;
            if(chi < 1e-4) chi = 1e-4;

            h_new = 0.95 * h / chi;

            if(fabs(dt) < eps) {
                x += h;
                ans += I_2;
                error += fabs(dt);
            }

            h = h_new;
            if(x + h > b) h = b - x;
        }

        return_value[0] = ans;
        return_value[1] = error;

        return return_value;
    }